

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::emitCurrentIndexChanged(QComboBoxPrivate *this,QModelIndex *index)

{
  QObject *obj;
  long in_FS_OFFSET;
  QAccessibleValueChangeEvent event;
  QArrayDataPointer<char16_t> local_a8;
  QVariant local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  obj = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  itemText((QString *)&local_a8,this,index);
  QComboBox::currentIndexChanged((QComboBox *)obj,index->r);
  if (this->lineEdit == (QLineEdit *)0x0) {
    updateCurrentText(this,(QString *)&local_a8);
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant(&local_88,(QString *)&local_a8);
  QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)&local_68,obj,&local_88);
  ::QVariant::~QVariant(&local_88);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
  QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
            ((QAccessibleValueChangeEvent *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::emitCurrentIndexChanged(const QModelIndex &index)
{
    Q_Q(QComboBox);
    const QString text = itemText(index);
    emit q->currentIndexChanged(index.row());
    // signal lineEdit.textChanged already connected to signal currentTextChanged, so don't emit double here
    if (!lineEdit)
        updateCurrentText(text);
#if QT_CONFIG(accessibility)
    QAccessibleValueChangeEvent event(q, text);
    QAccessible::updateAccessibility(&event);
#endif
}